

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O0

SXML_CHAR * strcat_alloc(SXML_CHAR **src1,SXML_CHAR *src2)

{
  size_t sVar1;
  SXML_CHAR *pSVar2;
  undefined4 local_38;
  int n;
  SXML_CHAR *cat;
  SXML_CHAR *src2_local;
  SXML_CHAR **src1_local;
  
  if ((src1 == (SXML_CHAR **)0x0) || (*src1 == src2)) {
    src1_local = (SXML_CHAR **)0x0;
  }
  else if ((src2 == (SXML_CHAR *)0x0) || (*src2 == '\0')) {
    src1_local = (SXML_CHAR **)*src1;
  }
  else {
    if (*src1 == (SXML_CHAR *)0x0) {
      local_38 = 0;
    }
    else {
      sVar1 = strlen(*src1);
      local_38 = (int)sVar1;
    }
    sVar1 = strlen(src2);
    pSVar2 = (SXML_CHAR *)realloc(*src1,(long)(local_38 + (int)sVar1 + 1));
    if (pSVar2 == (SXML_CHAR *)0x0) {
      src1_local = (SXML_CHAR **)0x0;
    }
    else {
      if (*src1 == (SXML_CHAR *)0x0) {
        *pSVar2 = '\0';
      }
      *src1 = pSVar2;
      strcat(*src1,src2);
      src1_local = (SXML_CHAR **)*src1;
    }
  }
  return (SXML_CHAR *)src1_local;
}

Assistant:

SXML_CHAR* strcat_alloc(SXML_CHAR** src1, const SXML_CHAR* src2)
{
	SXML_CHAR* cat;
	int n;

	/* Do not concatenate '*src1' with itself */
	if (src1 == NULL || *src1 == src2)
		return NULL;

	/* Concatenate a NULL or empty string */
	if (src2 == NULL || *src2 == NULC)
		return *src1;

	n = (*src1 == NULL ? 0 : sx_strlen(*src1)) + sx_strlen(src2) + 1;
	cat = __realloc(*src1, n*sizeof(SXML_CHAR));
	if (cat == NULL)
		return NULL;
	if (*src1 == NULL)
		*cat = NULC;
	*src1 = cat;
	sx_strcat(*src1, src2);

	return *src1;
}